

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Render(void)

{
  ImDrawDataBuilder *out_list;
  ImGuiWindow *window;
  ImDrawList *pIVar1;
  _func_void_ImDrawData_ptr *UNRECOVERED_JUMPTABLE;
  ImGuiContext *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ImDrawList **ppIVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  ImGuiWindow *pIVar12;
  ulong uVar13;
  ImGuiWindow *pIVar14;
  
  pIVar2 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                  ,0xfdd,"void ImGui::Render()");
  }
  iVar5 = GImGui->FrameCountEnded;
  if (iVar5 != GImGui->FrameCount) {
    EndFrame();
    iVar5 = pIVar2->FrameCount;
  }
  pIVar2->FrameCountRendered = iVar5;
  (pIVar2->IO).MetricsRenderWindows = 0;
  (pIVar2->IO).MetricsRenderVertices = 0;
  (pIVar2->IO).MetricsRenderIndices = 0;
  out_list = &pIVar2->DrawDataBuilder;
  ImDrawDataBuilder::Clear(out_list);
  if ((pIVar2->BackgroundDrawList).VtxBuffer.Size != 0) {
    AddDrawListToDrawData(out_list->Layers,&pIVar2->BackgroundDrawList);
  }
  pIVar14 = pIVar2->NavWindowingTarget;
  if (pIVar14 == (ImGuiWindow *)0x0) {
    pIVar14 = (ImGuiWindow *)0x0;
    pIVar12 = (ImGuiWindow *)0x0;
  }
  else {
    if ((pIVar14->Flags & 0x2000) == 0) {
      pIVar14 = pIVar14->RootWindow;
    }
    else {
      pIVar14 = (ImGuiWindow *)0x0;
    }
    pIVar12 = pIVar2->NavWindowingList;
  }
  uVar6 = (pIVar2->Windows).Size;
  if (uVar6 != 0) {
    uVar13 = 0;
    do {
      if ((long)(int)uVar6 <= (long)uVar13) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                      ,0x4e6,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      window = (pIVar2->Windows).Data[uVar13];
      if ((window->Active == true) && (window->Hidden == false)) {
        if ((window != pIVar12 && window != pIVar14) && (window->Flags & 0x1000000U) == 0) {
          AddWindowToDrawData((ImVector<ImDrawList_*> *)
                              ((long)&(GImGui->DrawDataBuilder).Layers[0].Size +
                              (ulong)((uint)window->Flags >> 0x15 & 0x10)),window);
          uVar6 = (pIVar2->Windows).Size;
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar6);
  }
  bVar4 = true;
  do {
    bVar9 = bVar4;
    if (((pIVar14 != (ImGuiWindow *)0x0) && (pIVar14->Active == true)) && (pIVar14->Hidden == false)
       ) {
      AddWindowToDrawData((ImVector<ImDrawList_*> *)
                          ((long)&(GImGui->DrawDataBuilder).Layers[0].Size +
                          (ulong)((uint)pIVar14->Flags >> 0x15 & 0x10)),pIVar14);
    }
    pIVar14 = pIVar12;
    bVar4 = false;
  } while (bVar9);
  ImDrawDataBuilder::FlattenIntoSingleLayer(out_list);
  if ((pIVar2->IO).MouseDrawCursor != false) {
    RenderMouseCursor(&pIVar2->ForegroundDrawList,(pIVar2->IO).MousePos,
                      (pIVar2->Style).MouseCursorScale,pIVar2->MouseCursor,0xffffffff,0xff000000,
                      0x30000000);
  }
  if ((pIVar2->ForegroundDrawList).VtxBuffer.Size != 0) {
    AddDrawListToDrawData(out_list->Layers,&pIVar2->ForegroundDrawList);
  }
  pIVar3 = GImGui;
  if (GImGui != (ImGuiContext *)0x0) {
    (pIVar2->DrawData).Valid = true;
    iVar5 = out_list->Layers[0].Size;
    if ((long)iVar5 < 1) {
      ppIVar8 = (ImDrawList **)0x0;
    }
    else {
      ppIVar8 = (pIVar2->DrawDataBuilder).Layers[0].Data;
    }
    (pIVar2->DrawData).CmdLists = ppIVar8;
    (pIVar2->DrawData).CmdListsCount = iVar5;
    (pIVar2->DrawData).TotalIdxCount = 0;
    (pIVar2->DrawData).TotalVtxCount = 0;
    (pIVar2->DrawData).DisplayPos.x = 0.0;
    (pIVar2->DrawData).DisplayPos.y = 0.0;
    (pIVar2->DrawData).DisplaySize = (pIVar3->IO).DisplaySize;
    (pIVar2->DrawData).FramebufferScale = (pIVar3->IO).DisplayFramebufferScale;
    if (iVar5 < 1) {
      (pIVar2->IO).MetricsRenderVertices = 0;
      (pIVar2->IO).MetricsRenderIndices = 0;
    }
    else {
      lVar11 = 0;
      iVar7 = 0;
      iVar10 = 0;
      do {
        pIVar1 = (pIVar2->DrawDataBuilder).Layers[0].Data[lVar11];
        iVar10 = iVar10 + (pIVar1->VtxBuffer).Size;
        iVar7 = iVar7 + (pIVar1->IdxBuffer).Size;
        lVar11 = lVar11 + 1;
      } while (iVar5 != lVar11);
      (pIVar2->DrawData).TotalVtxCount = iVar10;
      (pIVar2->DrawData).TotalIdxCount = iVar7;
      (pIVar2->IO).MetricsRenderVertices = iVar10;
      (pIVar2->IO).MetricsRenderIndices = iVar7;
      if ((0 < iVar5) &&
         (UNRECOVERED_JUMPTABLE = (pIVar2->IO).RenderDrawListsFn,
         UNRECOVERED_JUMPTABLE != (_func_void_ImDrawData_ptr *)0x0)) {
        (*UNRECOVERED_JUMPTABLE)(&pIVar2->DrawData);
        return;
      }
    }
    return;
  }
  __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                ,0xc23,"ImGuiIO &ImGui::GetIO()");
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;

    // Gather ImDrawList to render (for each active window)
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = g.IO.MetricsRenderWindows = 0;
    g.DrawDataBuilder.Clear();
    if (!g.BackgroundDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.BackgroundDrawList);

    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = g.NavWindowingTarget ? g.NavWindowingList : NULL;
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);
    g.DrawDataBuilder.FlattenIntoSingleLayer();

    // Draw software mouse cursor if requested
    if (g.IO.MouseDrawCursor)
        RenderMouseCursor(&g.ForegroundDrawList, g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

    if (!g.ForegroundDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.ForegroundDrawList);

    // Setup ImDrawData structure for end-user
    SetupDrawData(&g.DrawDataBuilder.Layers[0], &g.DrawData);
    g.IO.MetricsRenderVertices = g.DrawData.TotalVtxCount;
    g.IO.MetricsRenderIndices = g.DrawData.TotalIdxCount;

    // (Legacy) Call the Render callback function. The current prefer way is to let the user retrieve GetDrawData() and call the render function themselves.
#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    if (g.DrawData.CmdListsCount > 0 && g.IO.RenderDrawListsFn != NULL)
        g.IO.RenderDrawListsFn(&g.DrawData);
#endif
}